

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O0

void __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription::addJacobianBlock
          (MultipleShootingTranscription *this,size_t initRow,size_t initCol,
          SparsityStructure *sparsity)

{
  size_t sVar1;
  SparsityStructure *this_00;
  size_t in_RDX;
  size_t in_RSI;
  long in_RDI;
  size_t i;
  size_t index;
  size_t in_stack_ffffffffffffff90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff98;
  MultipleShootingTranscription *in_stack_ffffffffffffffa0;
  undefined8 local_28;
  
  local_28 = 0;
  while( true ) {
    sVar1 = SparsityStructure::size((SparsityStructure *)0x3319a8);
    if (sVar1 <= local_28) break;
    this_00 = (SparsityStructure *)(in_RDI + 0xf0);
    sVar1 = *(size_t *)(in_RDI + 0x288);
    index = in_RSI;
    SparsityStructure::operator[](this_00,in_RSI);
    addNonZero(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,sVar1);
    in_stack_ffffffffffffff98 =
         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x108);
    in_stack_ffffffffffffffa0 = *(MultipleShootingTranscription **)(in_RDI + 0x288);
    in_stack_ffffffffffffff90 = in_RDX;
    SparsityStructure::operator[](this_00,index);
    addNonZero(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,sVar1);
    *(long *)(in_RDI + 0x288) = *(long *)(in_RDI + 0x288) + 1;
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void addJacobianBlock(size_t initRow, size_t initCol, const SparsityStructure& sparsity){
                for (size_t i = 0; i < sparsity.size(); ++i) {
                    addNonZero(m_jacobianNZRows, m_jacobianNonZeros, initRow + sparsity[i].row);
                    addNonZero(m_jacobianNZCols, m_jacobianNonZeros, initCol + sparsity[i].col);
                    m_jacobianNonZeros++;
                }
            }